

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O0

WeightedIsomapAveraging * __thiscall
WeightedIsomapAveraging::add_and_merge(WeightedIsomapAveraging *this,Mat *isomap)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Vec<unsigned_char,_4> *pVVar5;
  Mat *pMVar6;
  Vec<float,_4> *pVVar7;
  float *pfVar8;
  int *piVar9;
  byte *pbVar10;
  Mat *in_RDX;
  _OutputArray local_48;
  undefined1 local_29;
  int local_28;
  int local_24;
  int c;
  int r;
  Mat *isomap_local;
  WeightedIsomapAveraging *this_local;
  Mat *merged_isomap_uchar;
  
  _c = in_RDX;
  isomap_local = isomap;
  this_local = this;
  for (local_24 = 0; local_24 < *(int *)(_c + 8); local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < *(int *)(_c + 0xc); local_28 = local_28 + 1) {
      pVVar5 = cv::Mat::at<cv::Vec<unsigned_char,4>>(_c,local_24,local_28);
      pMVar6 = (Mat *)cv::Vec<unsigned_char,_4>::operator[](pVVar5,3);
      if ((byte)isomap[0xc0] < (byte)*pMVar6) {
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,0);
        fVar1 = *pfVar8;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        iVar3 = *piVar9;
        pVVar5 = cv::Mat::at<cv::Vec<unsigned_char,4>>(_c,local_24,local_28);
        pbVar10 = cv::Vec<unsigned_char,_4>::operator[](pVVar5,0);
        bVar2 = *pbVar10;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        iVar4 = *piVar9;
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,0);
        *pfVar8 = (fVar1 * (float)iVar3 + (float)bVar2) / (float)(iVar4 + 1);
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,1);
        fVar1 = *pfVar8;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        iVar3 = *piVar9;
        pVVar5 = cv::Mat::at<cv::Vec<unsigned_char,4>>(_c,local_24,local_28);
        pbVar10 = cv::Vec<unsigned_char,_4>::operator[](pVVar5,1);
        bVar2 = *pbVar10;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        iVar4 = *piVar9;
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,1);
        *pfVar8 = (fVar1 * (float)iVar3 + (float)bVar2) / (float)(iVar4 + 1);
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,2);
        fVar1 = *pfVar8;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        iVar3 = *piVar9;
        pVVar5 = cv::Mat::at<cv::Vec<unsigned_char,4>>(_c,local_24,local_28);
        pbVar10 = cv::Vec<unsigned_char,_4>::operator[](pVVar5,2);
        bVar2 = *pbVar10;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        iVar4 = *piVar9;
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,2);
        *pfVar8 = (fVar1 * (float)iVar3 + (float)bVar2) / (float)(iVar4 + 1);
        pVVar7 = cv::Mat::at<cv::Vec<float,4>>(isomap + 0x60,local_24,local_28);
        pfVar8 = cv::Vec<float,_4>::operator[](pVVar7,3);
        *pfVar8 = 255.0;
        piVar9 = cv::Mat::at<int>(isomap,local_24,local_28);
        *piVar9 = *piVar9 + 1;
      }
    }
  }
  local_29 = 0;
  cv::Mat::Mat(&this->visibility_counter);
  cv::_OutputArray::_OutputArray(&local_48,&this->visibility_counter);
  cv::Mat::convertTo((_OutputArray *)(isomap + 0x60),(int)&local_48,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_48);
  return this;
}

Assistant:

cv::Mat add_and_merge(const cv::Mat& isomap)
    {
        // Merge isomaps, add the current to the already merged, pixel by pixel:
        for (int r = 0; r < isomap.rows; ++r)
        {
            for (int c = 0; c < isomap.cols; ++c)
            {
                if (isomap.at<cv::Vec4b>(r, c)[3] <= threshold)
                {
                    continue; // ignore this pixel, not visible in the extracted isomap of this current frame
                }
                // we're sure to have a visible pixel, merge it:
                // merged_pixel = (old_average * visible_count + new_pixel) / (visible_count + 1)
                merged_isomap.at<cv::Vec4f>(r, c)[0] = (merged_isomap.at<cv::Vec4f>(r, c)[0] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[0]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[1] = (merged_isomap.at<cv::Vec4f>(r, c)[1] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[1]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[2] = (merged_isomap.at<cv::Vec4f>(r, c)[2] * visibility_counter.at<int>(r, c) + isomap.at<cv::Vec4b>(r, c)[2]) / (visibility_counter.at<int>(r, c) + 1);
                merged_isomap.at<cv::Vec4f>(r, c)[3] = 255; // as soon as we've seen the pixel visible once, we set it to visible.
                ++visibility_counter.at<int>(r, c);
            }
        }
        cv::Mat merged_isomap_uchar;
        merged_isomap.convertTo(merged_isomap_uchar, CV_8UC4);
        return merged_isomap_uchar;
    }